

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O1

void __thiscall
wasm::WATParser::ParseTypeDefsCtx::addStructType(ParseTypeDefsCtx *this,StructT *type)

{
  char *pcVar1;
  size_t sVar2;
  uint in_EAX;
  pointer pNVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  TypeBuilder::setHeapType(this->builder,(ulong)this->index,&type->second);
  uStack_38 = (ulong)(uint)uStack_38;
  pNVar3 = (type->first).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((type->first).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_finish != pNVar3) {
    uVar5 = 0;
    do {
      pcVar1 = pNVar3[uVar5].super_IString.str._M_str;
      if (pcVar1 != (char *)0x0) {
        sVar2 = pNVar3[uVar5].super_IString.str._M_len;
        pmVar4 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&(this->names).
                                  super__Vector_base<wasm::TypeNames,_std::allocator<wasm::TypeNames>_>
                                  ._M_impl.super__Vector_impl_data._M_start[this->index].fieldNames,
                              (key_type *)((long)&uStack_38 + 4));
        (pmVar4->super_IString).str._M_len = sVar2;
        (pmVar4->super_IString).str._M_str = pcVar1;
      }
      uVar5 = (ulong)(uStack_38._4_4_ + 1U);
      uStack_38 = CONCAT44(uStack_38._4_4_ + 1U,(uint)uStack_38);
      pNVar3 = (type->first).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(type->first).
                                   super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pNVar3 >> 4));
  }
  return;
}

Assistant:

void addStructType(StructT& type) {
    auto& [fieldNames, str] = type;
    builder[index] = str;
    for (Index i = 0; i < fieldNames.size(); ++i) {
      if (auto name = fieldNames[i]; name.is()) {
        names[index].fieldNames[i] = name;
      }
    }
  }